

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O1

void __thiscall
cmake::AddCacheEntry(cmake *this,string *key,cmValue value,cmValue helpString,int type)

{
  pointer __s1;
  size_type sVar1;
  cmMessenger *pcVar2;
  bool bVar3;
  int iVar4;
  char *extraout_RDX;
  char *extraout_RDX_00;
  size_type __rlen;
  string_view value_00;
  string_view value_01;
  string_view value_02;
  string_view value_03;
  
  if (helpString.Value == (string *)0x0) {
    helpString.Value = &cmValue::Empty_abi_cxx11_;
  }
  cmState::AddCacheEntry
            ((this->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
             super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
             super__Head_base<0UL,_cmState_*,_false>._M_head_impl,key,value,helpString.Value,type);
  UnwatchUnusedCli(this,key);
  __s1 = (key->_M_dataplus)._M_p;
  sVar1 = key->_M_string_length;
  if ((long)sVar1 < 0x1f) {
    if ((sVar1 == 0x15) && (iVar4 = bcmp(__s1,"CMAKE_WARN_DEPRECATED",0x15), iVar4 == 0)) {
      pcVar2 = (this->Messenger)._M_t.
               super___uniq_ptr_impl<cmMessenger,_std::default_delete<cmMessenger>_>._M_t.
               super__Tuple_impl<0UL,_cmMessenger_*,_std::default_delete<cmMessenger>_>.
               super__Head_base<0UL,_cmMessenger_*,_false>._M_head_impl;
      if (value.Value == (string *)0x0) {
        bVar3 = false;
      }
      else {
        value_03._M_str = ((value.Value)->_M_dataplus)._M_p;
        value_03._M_len = (value.Value)->_M_string_length;
        bVar3 = cmValue::IsOff(value_03);
      }
      pcVar2->SuppressDeprecatedWarnings = bVar3;
      return;
    }
    if (sVar1 != 0x16) {
      return;
    }
    iVar4 = bcmp(__s1,"CMAKE_ERROR_DEPRECATED",0x16);
    if (iVar4 == 0) {
      pcVar2 = (this->Messenger)._M_t.
               super___uniq_ptr_impl<cmMessenger,_std::default_delete<cmMessenger>_>._M_t.
               super__Tuple_impl<0UL,_cmMessenger_*,_std::default_delete<cmMessenger>_>.
               super__Head_base<0UL,_cmMessenger_*,_false>._M_head_impl;
      if (value.Value == (string *)0x0) {
        bVar3 = false;
      }
      else {
        value_01._M_str = extraout_RDX;
        value_01._M_len = (size_t)((value.Value)->_M_dataplus)._M_p;
        bVar3 = cmValue::IsOn((cmValue *)(value.Value)->_M_string_length,value_01);
      }
      pcVar2->DeprecatedWarningsAsErrors = bVar3;
      return;
    }
  }
  if (sVar1 == 0x1f) {
    iVar4 = bcmp(__s1,"CMAKE_SUPPRESS_DEVELOPER_ERRORS",0x1f);
    if (iVar4 == 0) {
      pcVar2 = (this->Messenger)._M_t.
               super___uniq_ptr_impl<cmMessenger,_std::default_delete<cmMessenger>_>._M_t.
               super__Tuple_impl<0UL,_cmMessenger_*,_std::default_delete<cmMessenger>_>.
               super__Head_base<0UL,_cmMessenger_*,_false>._M_head_impl;
      if (value.Value == (string *)0x0) {
        bVar3 = false;
      }
      else {
        value_02._M_str = ((value.Value)->_M_dataplus)._M_p;
        value_02._M_len = (value.Value)->_M_string_length;
        bVar3 = cmValue::IsOff(value_02);
      }
      pcVar2->DevWarningsAsErrors = bVar3;
    }
  }
  else if ((sVar1 == 0x21) &&
          (iVar4 = bcmp(__s1,"CMAKE_SUPPRESS_DEVELOPER_WARNINGS",0x21), iVar4 == 0)) {
    pcVar2 = (this->Messenger)._M_t.
             super___uniq_ptr_impl<cmMessenger,_std::default_delete<cmMessenger>_>._M_t.
             super__Tuple_impl<0UL,_cmMessenger_*,_std::default_delete<cmMessenger>_>.
             super__Head_base<0UL,_cmMessenger_*,_false>._M_head_impl;
    if (value.Value == (string *)0x0) {
      bVar3 = false;
    }
    else {
      value_00._M_str = extraout_RDX_00;
      value_00._M_len = (size_t)((value.Value)->_M_dataplus)._M_p;
      bVar3 = cmValue::IsOn((cmValue *)(value.Value)->_M_string_length,value_00);
    }
    pcVar2->SuppressDevWarnings = bVar3;
  }
  return;
}

Assistant:

void cmake::AddCacheEntry(const std::string& key, cmValue value,
                          cmValue helpString, int type)
{
  this->State->AddCacheEntry(key, value, helpString,
                             static_cast<cmStateEnums::CacheEntryType>(type));
  this->UnwatchUnusedCli(key);

  if (key == "CMAKE_WARN_DEPRECATED"_s) {
    this->Messenger->SetSuppressDeprecatedWarnings(value && value.IsOff());
  } else if (key == "CMAKE_ERROR_DEPRECATED"_s) {
    this->Messenger->SetDeprecatedWarningsAsErrors(value.IsOn());
  } else if (key == "CMAKE_SUPPRESS_DEVELOPER_WARNINGS"_s) {
    this->Messenger->SetSuppressDevWarnings(value.IsOn());
  } else if (key == "CMAKE_SUPPRESS_DEVELOPER_ERRORS"_s) {
    this->Messenger->SetDevWarningsAsErrors(value && value.IsOff());
  }
}